

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildUnionEnumSwitchCaseWritter
          (SwiftGenerator *this,EnumDef *ed)

{
  EnumVal *this_00;
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar2;
  reference ppEVar3;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined4 local_190;
  byte local_189;
  string local_188;
  undefined1 local_168 [8];
  string is_struct;
  string type;
  string variant;
  EnumVal ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_58;
  const_iterator it;
  allocator<char> local_39;
  string local_38;
  EnumDef *local_18;
  EnumDef *ed_local;
  SwiftGenerator *this_local;
  
  local_18 = ed;
  ed_local = (EnumDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"switch type {",&local_39);
  CodeWriter::operator+=(&this->code_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pvVar2 = EnumDef::Vals(local_18);
  local_58._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2);
  while( true ) {
    pvVar2 = EnumDef::Vals(local_18);
    ev.value = (int64_t)std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                        ::end(pvVar2);
    bVar1 = __gnu_cxx::operator<
                      (&local_58,
                       (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                        *)&ev.value);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_58);
    this_00 = (EnumVal *)((long)&variant.field_2 + 8);
    EnumVal::EnumVal(this_00,*ppEVar3);
    IdlNamer::LegacySwiftVariant_abi_cxx11_
              ((string *)((long)&type.field_2 + 8),&this->namer_,this_00);
    GenType_abi_cxx11_((string *)((long)&is_struct.field_2 + 8),this,
                       (Type *)&ev.doc_comment.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
    local_189 = 0;
    bVar1 = IsStruct((Type *)&ev.doc_comment.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      Mutable_abi_cxx11_(&local_188,this);
      local_189 = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&is_struct.field_2 + 8),&local_188);
    }
    else {
      std::__cxx11::string::string
                ((string *)local_168,(string *)(is_struct.field_2._M_local_buf + 8));
    }
    if ((local_189 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_188);
    }
    if ((int)ev.doc_comment.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
      local_190 = 4;
    }
    else {
      std::operator+(&local_1d0,"case .",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type.field_2 + 8));
      std::operator+(&local_1b0,&local_1d0,":");
      CodeWriter::operator+=(&this->code_,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      Indent(this);
      GenType_abi_cxx11_(&local_210,this,
                         (Type *)&ev.doc_comment.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
      std::operator+(&local_1f0,"var __obj = value as? ",&local_210);
      CodeWriter::operator+=(&this->code_,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::operator+(&local_250,"return ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168)
      ;
      std::operator+(&local_230,&local_250,".pack(&builder, obj: &__obj)");
      CodeWriter::operator+=(&this->code_,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      Outdent(this);
      local_190 = 0;
    }
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string((string *)(is_struct.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
    EnumVal::~EnumVal((EnumVal *)((long)&variant.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_58);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"default: return Offset()",&local_271);
  CodeWriter::operator+=(&this->code_,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"}",&local_299);
  CodeWriter::operator+=(&this->code_,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  return;
}

Assistant:

void BuildUnionEnumSwitchCaseWritter(const EnumDef &ed) {
    code_ += "switch type {";
    for (auto it = ed.Vals().begin(); it < ed.Vals().end(); ++it) {
      const auto ev = **it;
      const auto variant = namer_.LegacySwiftVariant(ev);
      const auto type = GenType(ev.union_type);
      const auto is_struct = IsStruct(ev.union_type) ? type + Mutable() : type;
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      code_ += "case ." + variant + ":";
      Indent();
      code_ += "var __obj = value as? " + GenType(ev.union_type, true);
      code_ += "return " + is_struct + ".pack(&builder, obj: &__obj)";
      Outdent();
    }
    code_ += "default: return Offset()";
    code_ += "}";
  }